

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O2

string * __thiscall
cmOutputConverter::ConvertDirectorySeparatorsForShell
          (string *__return_storage_ptr__,cmOutputConverter *this,string *source)

{
  pointer pcVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  bool bVar2;
  undefined8 in_RAX;
  cmState *pcVar3;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)source);
  pcVar3 = cmStateSnapshot::GetState(&this->StateSnapshot);
  bVar2 = cmState::UseMSYSShell(pcVar3);
  if ((((bVar2) && (this->LinkScriptShell == false)) &&
      (2 < __return_storage_ptr__->_M_string_length)) &&
     (pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p, pcVar1[1] == ':')) {
    pcVar1[1] = *pcVar1;
    *(__return_storage_ptr__->_M_dataplus)._M_p = '/';
  }
  pcVar3 = cmStateSnapshot::GetState(&this->StateSnapshot);
  bVar2 = cmState::UseWindowsShell(pcVar3);
  if (bVar2) {
    __first._M_current = (__return_storage_ptr__->_M_dataplus)._M_p;
    uStack_18 = CONCAT17(0x2f,CONCAT16(0x5c,(undefined6)uStack_18));
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (__first,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(__first._M_current + __return_storage_ptr__->_M_string_length),
               (char *)((long)&uStack_18 + 7),(char *)((long)&uStack_18 + 6));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::ConvertDirectorySeparatorsForShell(
  const std::string& source) const
{
  std::string result = source;
  // For the MSYS shell convert drive letters to posix paths, so
  // that c:/some/path becomes /c/some/path.  This is needed to
  // avoid problems with the shell path translation.
  if (this->GetState()->UseMSYSShell() && !this->LinkScriptShell) {
    if (result.size() > 2 && result[1] == ':') {
      result[1] = result[0];
      result[0] = '/';
    }
  }
  if (this->GetState()->UseWindowsShell()) {
    std::replace(result.begin(), result.end(), '/', '\\');
  }
  return result;
}